

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

Hash __thiscall
Fossilize::StateRecorder::Impl::get_application_link_hash(Impl *this,ResourceTag tag,Hash hash)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (this->application_feature_hash).application_info_hash;
  uVar1 = (this->application_feature_hash).physical_device_features_hash;
  uVar2 = (uVar1 & 0xffffffff ^
          ((uVar2 & 0xffffffff ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^ uVar2 >> 0x20) *
          0x100000001b3) * 0x100000001b3;
  return (hash & 0xffffffff ^
         ((ulong)tag ^
         ((uVar1 >> 0x20 ^ 0xaf63bd4c8601b7df ^ uVar2 & 0xffffffff) * 0x100000001b3 ^ uVar2 >> 0x20)
         * 0x100000001b3) * 0x100000001b3) * 0x100000001b3 ^ hash >> 0x20;
}

Assistant:

Hash StateRecorder::Impl::get_application_link_hash(ResourceTag tag, Hash hash) const
{
	return Hashing::compute_hash_application_info_link(application_feature_hash, tag, hash);
}